

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O1

int If_ManSatCheckXY(void *pSat,int nLutSize,word *pTruth,int nVars,uint uSet,word *pTBound,
                    word *pTFree,Vec_Int_t *vLits)

{
  int iVar1;
  word *pTruth_00;
  word *pTruth_01;
  byte bVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  word uFree;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int nSSet;
  int nBSet;
  int nFSet;
  word *local_120;
  uint local_118;
  int local_114;
  sat_solver *local_110;
  word *local_108;
  word Res;
  int pFSet [15];
  int pSSet [15];
  int pBSet [15];
  
  nBSet = 0;
  nSSet = 0;
  nFSet = 0;
  bVar5 = (byte)nLutSize;
  local_118 = 1 << (bVar5 & 0x1f);
  local_114 = nLutSize * 2 + -1;
  uVar14 = 1 << ((byte)local_114 & 0x1f);
  local_120 = pTBound;
  local_110 = (sat_solver *)pSat;
  local_108 = pTruth;
  Dau_DecSortSet(uSet,nVars,&nBSet,&nSSet,&nFSet);
  if (nBSet + nSSet + nFSet != nVars) {
    __assert_fail("nBSet + nSSet + nFSet == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa3,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize < nBSet + nSSet) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa5,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  iVar3 = nSSet + nLutSize + nFSet;
  if (SBORROW4(iVar3,nLutSize * 2) == iVar3 + nLutSize * -2 < 0) {
    __assert_fail("nLutSize + nSSet + nFSet <= 2*nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa6,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (vLits->nCap < (int)uVar14) {
    if (vLits->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar14 << 2);
    }
    else {
      piVar4 = (int *)realloc(vLits->pArray,(long)(int)uVar14 << 2);
    }
    vLits->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLits->nCap = uVar14;
  }
  if (local_114 != 0x1f) {
    memset(vLits->pArray,0xff,(ulong)uVar14 << 2);
  }
  pTruth_01 = local_108;
  vLits->nSize = uVar14;
  if (nVars != 0x1f) {
    uVar14 = 1 << ((byte)nVars & 0x1f);
    if ((int)uVar14 < 2) {
      uVar14 = 1;
    }
    uVar12 = 0;
    do {
      iVar3 = 0;
      iVar6 = 0;
      uVar8 = 0;
      uVar11 = (uint)uVar12;
      if (0 < nVars) {
        uVar16 = 0;
        uVar15 = 0;
        uVar8 = 0;
        bVar2 = 0;
        switch(uSet & 3) {
        case 1:
          goto switchD_00409721_caseD_1;
        case 2:
switchD_00409721_caseD_2:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                        ,0xc6,
                        "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                       );
        case 3:
          goto switchD_00409721_caseD_3;
        }
switchD_00409721_caseD_0:
        if ((uVar11 >> (uVar15 & 0x1f) & 1) != 0) {
          uVar8 = uVar8 | 1 << (iVar3 + nLutSize + nSSet & 0x1fU);
          pFSet[iVar3] = uVar15;
        }
        iVar3 = iVar3 + 1;
        do {
          uVar15 = uVar15 + 1;
          if (nVars == uVar15) break;
          bVar2 = bVar2 + 2;
          switch(uSet >> (bVar2 & 0x1f) & 3) {
          case 0:
            goto switchD_00409721_caseD_0;
          case 1:
switchD_00409721_caseD_1:
            if ((uVar11 >> (uVar15 & 0x1f) & 1) != 0) {
              uVar8 = uVar8 | 1 << (nSSet + iVar6 & 0x1fU);
              pBSet[iVar6] = uVar15;
            }
            iVar6 = iVar6 + 1;
            break;
          case 2:
            goto switchD_00409721_caseD_2;
          case 3:
switchD_00409721_caseD_3:
            if ((uVar11 >> (uVar15 & 0x1f) & 1) != 0) {
              uVar8 = uVar8 | 1 << ((char)uVar16 + bVar5 & 0x1f) | 1 << (uVar16 & 0x1f);
              pSSet[(int)uVar16] = uVar15;
            }
            uVar16 = uVar16 + 1;
          }
        } while( true );
      }
      if ((iVar6 != nBSet) || (iVar3 != nFSet)) {
        __assert_fail("iBSet == nBSet && iFSet == nFSet",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,200,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      if (((int)uVar8 < 0) || (vLits->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vLits->pArray[uVar8] != -1) {
        __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xc9,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      vLits->pArray[uVar8] = (uint)((local_108[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0);
      uVar12 = (ulong)(uVar11 + 1);
    } while (uVar11 + 1 != uVar14);
  }
  uVar14 = vLits->nSize;
  uVar12 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar11 = 0;
  }
  else {
    piVar4 = vLits->pArray;
    iVar6 = 2 << (bVar5 & 0x1f);
    iVar3 = iVar6 * 2;
    lVar9 = 0;
    uVar11 = 0;
    do {
      iVar1 = piVar4[lVar9];
      if (-1 < iVar1) {
        if (iVar6 + (int)lVar9 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (((int)uVar11 < 0) || ((int)uVar12 <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar12 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
        piVar4[uVar12] = iVar3 + (uint)(iVar1 == 0);
      }
      lVar9 = lVar9 + 1;
      uVar14 = vLits->nSize;
      uVar12 = (ulong)(int)uVar14;
      iVar3 = iVar3 + 2;
    } while (lVar9 < (long)uVar12);
  }
  if ((int)uVar14 < (int)uVar11) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vLits->nSize = uVar11;
  iVar6 = 0;
  iVar3 = sat_solver_solve(local_110,vLits->pArray,vLits->pArray + (int)uVar11,0,0,0,0);
  pTruth_00 = local_120;
  if ((iVar3 != 1) || (iVar6 = 1, pTFree == (word *)0x0 || local_120 == (word *)0x0)) {
    return iVar6;
  }
  uVar14 = nBSet + nSSet;
  if (nLutSize < (int)uVar14) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xdd,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  *local_120 = 0;
  if (uVar14 != 0x1f) {
    uVar8 = 1 << ((byte)uVar14 & 0x1f);
    uVar12 = 0;
    uVar11 = local_110->size;
    if (local_110->size < 1) {
      uVar11 = 0;
    }
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 2) {
      uVar10 = 1;
    }
    do {
      if (uVar11 == uVar12) goto LAB_00409cfd;
      if (local_110->model[uVar12] == 1) {
        local_120[uVar12 >> 6 & 0x3ffffff] =
             local_120[uVar12 >> 6 & 0x3ffffff] | 1L << ((byte)uVar12 & 0x3f);
      }
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  if (-1 < (int)uVar14) {
    uVar11 = 1;
    if (1 < uVar14) {
      uVar11 = uVar14;
    }
    uVar8 = 2;
    if (1 < uVar14) {
      uVar8 = uVar11;
    }
    uVar11 = 3;
    if (uVar8 != 2) {
      uVar11 = uVar8;
    }
    uVar15 = 4;
    if (uVar11 != 3) {
      uVar15 = uVar11;
    }
    uVar16 = 5;
    if (uVar15 != 4) {
      uVar16 = uVar15;
    }
    if (uVar16 - 5 < 2) {
      uVar7 = (uint)*local_120;
      uVar13 = (uVar7 & 1) * 3;
      if (uVar14 != 0) {
        uVar13 = uVar7;
      }
      uVar12 = (ulong)(uVar13 & 3) * 5;
      if (1 < uVar14) {
        uVar12 = *local_120;
      }
      uVar14 = (uint)uVar12 & 0xf;
      uVar10 = (ulong)(uVar14 << 4 | uVar14);
      if (uVar8 != 2) {
        uVar10 = uVar12;
      }
      uVar12 = (ulong)(uint)((int)(uVar10 & 0xff) << 8) | uVar10 & 0xff;
      if (uVar11 != 3) {
        uVar12 = uVar10;
      }
      uVar10 = (ulong)(uint)((int)uVar12 << 0x10) | uVar12 & 0xffff;
      if (uVar15 != 4) {
        uVar10 = uVar12;
      }
      uVar12 = uVar10 << 0x20 | uVar10 & 0xffffffff;
      if (uVar16 != 5) {
        uVar12 = uVar10;
      }
      *local_120 = uVar12;
      if (nLutSize <= nFSet + nSSet) {
        __assert_fail("nSSet + nFSet + 1 <= nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xe5,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      *pTFree = 0;
      uVar14 = nSSet + nFSet + 1;
      if (uVar14 != 0x1f) {
        uVar11 = 1 << ((byte)uVar14 & 0x1f);
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
        uVar12 = 0;
        do {
          if ((nLutSize == 0x1f) || (local_110->size <= (int)(local_118 + (int)uVar12))) {
LAB_00409cfd:
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (local_110->model[local_118 + uVar12] == 1) {
            pTFree[uVar12 >> 6 & 0x3ffffff] =
                 pTFree[uVar12 >> 6 & 0x3ffffff] | 1L << ((byte)uVar12 & 0x3f);
          }
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      if ((int)uVar14 < 0) goto LAB_00409db7;
      uVar11 = 1;
      if (1 < uVar14) {
        uVar11 = uVar14;
      }
      uVar8 = 2;
      if (1 < uVar14) {
        uVar8 = uVar11;
      }
      uVar11 = 3;
      if (uVar8 != 2) {
        uVar11 = uVar8;
      }
      uVar15 = 4;
      if (uVar11 != 3) {
        uVar15 = uVar11;
      }
      uVar16 = 5;
      if (uVar15 != 4) {
        uVar16 = uVar15;
      }
      if (uVar16 - 5 < 2) {
        uVar7 = (uint)*pTFree;
        uVar13 = (uVar7 & 1) * 3;
        if (uVar14 != 0) {
          uVar13 = uVar7;
        }
        uVar12 = (ulong)(uVar13 & 3) * 5;
        if (1 < uVar14) {
          uVar12 = *pTFree;
        }
        uVar14 = (uint)uVar12 & 0xf;
        uVar10 = (ulong)(uVar14 << 4 | uVar14);
        if (uVar8 != 2) {
          uVar10 = uVar12;
        }
        uVar12 = (ulong)(uint)((int)(uVar10 & 0xff) << 8) | uVar10 & 0xff;
        if (uVar11 != 3) {
          uVar12 = uVar10;
        }
        uVar10 = (ulong)(uint)((int)uVar12 << 0x10) | uVar12 & 0xffff;
        if (uVar15 != 4) {
          uVar10 = uVar12;
        }
        uFree = (uVar10 & 0xffffffff) * 0x100000001;
        if (uVar16 != 5) {
          uFree = uVar10;
        }
        *pTFree = uFree;
        if (nLutSize != 4 || nVars != 6) {
          return 1;
        }
        Res = If_ManSat6Truth(*local_120,uFree,pBSet,nBSet,pSSet,nSSet,pFSet,nFSet);
        if (*pTruth_01 == Res) {
          return 1;
        }
        Dau_DsdPrintFromTruth(pTruth_01,6);
        Dau_DsdPrintFromTruth(&Res,6);
        Dau_DsdPrintFromTruth(pTruth_00,nBSet + nSSet);
        Dau_DsdPrintFromTruth(pTFree,nSSet + nFSet + 1);
        puts("Verification failed!");
        return 1;
      }
    }
    __assert_fail("nVars == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x39f,"word Abc_Tt6Stretch(word, int)");
  }
LAB_00409db7:
  __assert_fail("nVars >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                ,0x392,"word Abc_Tt6Stretch(word, int)");
}

Assistant:

int If_ManSatCheckXY( void * pSat, int nLutSize, word * pTruth, int nVars, unsigned uSet, word * pTBound, word * pTFree, Vec_Int_t * vLits )
{
    sat_solver * p = (sat_solver *)pSat;
    int iBSet, nBSet = 0, pBSet[IF_MAX_FUNC_LUTSIZE];
    int iSSet, nSSet = 0, pSSet[IF_MAX_FUNC_LUTSIZE];
    int iFSet, nFSet = 0, pFSet[IF_MAX_FUNC_LUTSIZE];
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int v, Value, m, mNew, nMintsFNew, nMintsLNew;
    word Res;
    // collect variable sets
    Dau_DecSortSet( uSet, nVars, &nBSet, &nSSet, &nFSet );
    assert( nBSet + nSSet + nFSet == nVars );
    // check variable bounds
    assert( nSSet + nBSet <= nLutSize );
    assert( nLutSize + nSSet + nFSet <= 2*nLutSize - 1 );
    nMintsFNew = (1 << (nLutSize + nSSet + nFSet));
    // remap minterms
    Vec_IntFill( vLits, nMintsF, -1 );
    for ( m = 0; m < (1 << nVars); m++ )
    {
        mNew = iBSet = iSSet = iFSet = 0;
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uSet >> (v << 1)) & 3);
            if ( Value == 0 ) // FS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nLutSize + nSSet + iFSet), pFSet[iFSet] = v;
                iFSet++;
            }
            else if ( Value == 1 ) // BS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nSSet + iBSet), pBSet[iBSet] = v;
                iBSet++;
            }
            else if ( Value == 3 ) // SS
            {
                if ( ((m >> v) & 1) )
                {
                    mNew |= 1 << iSSet;
                    mNew |= 1 << (nLutSize + iSSet);
                    pSSet[iSSet] = v;
                }
                iSSet++;
            }
            else assert( Value == 0 );
        }
        assert( iBSet == nBSet && iFSet == nFSet );
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
    {
//        printf( "%d", (Value >= 0) ? Value : 2 );
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(2 * nMintsL + m, !Value) );
    }
    Vec_IntShrink( vLits, v );
//    printf( " %d\n", Vec_IntSize(vLits) );
    // run SAT solver
    Value = sat_solver_solve( p, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    if ( Value != l_True )
        return 0;
    if ( pTBound && pTFree )
    {
        // collect config
        assert( nSSet + nBSet <= nLutSize );
        *pTBound = 0;
        nMintsLNew = (1 << (nSSet + nBSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, m) )
                Abc_TtSetBit( pTBound, m );
        *pTBound = Abc_Tt6Stretch( *pTBound, nSSet + nBSet );
        // collect configs
        assert( nSSet + nFSet + 1 <= nLutSize );
        *pTFree = 0;
        nMintsLNew = (1 << (1 + nSSet + nFSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, nMintsL+m) )
                Abc_TtSetBit( pTFree, m );
        *pTFree = Abc_Tt6Stretch( *pTFree, 1 + nSSet + nFSet );
        if ( nVars != 6 || nLutSize != 4 )
            return 1;
        // verify the result
        Res = If_ManSat6Truth( *pTBound, *pTFree, pBSet, nBSet, pSSet, nSSet, pFSet, nFSet );
        if ( pTruth[0] != Res )
        {
            Dau_DsdPrintFromTruth( pTruth,  nVars );
            Dau_DsdPrintFromTruth( &Res,    nVars );
            Dau_DsdPrintFromTruth( pTBound, nSSet+nBSet );
            Dau_DsdPrintFromTruth( pTFree,  nSSet+nFSet+1 );
            printf( "Verification failed!\n" );
        }
    }
    return 1;
}